

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encrypt.c
# Opt level: O0

void HPDF_PadOrTrancatePasswd(char *pwd,HPDF_BYTE *new_pwd)

{
  HPDF_UINT n;
  HPDF_UINT len;
  HPDF_BYTE *new_pwd_local;
  char *pwd_local;
  
  n = HPDF_StrLen(pwd,0x21);
  HPDF_MemSet(new_pwd,'\0',0x20);
  if (n < 0x20) {
    if (n != 0) {
      HPDF_MemCpy(new_pwd,(HPDF_BYTE *)pwd,n);
    }
    HPDF_MemCpy(new_pwd + n,HPDF_PADDING_STRING,0x20 - n);
  }
  else {
    HPDF_MemCpy(new_pwd,(HPDF_BYTE *)pwd,0x20);
  }
  return;
}

Assistant:

void
HPDF_PadOrTrancatePasswd  (const char  *pwd,
                           HPDF_BYTE        *new_pwd)
{
    HPDF_UINT len = HPDF_StrLen (pwd, HPDF_PASSWD_LEN + 1);

    HPDF_PTRACE((" HPDF_PadOrTrancatePasswd\n"));

    HPDF_MemSet (new_pwd, 0x00, HPDF_PASSWD_LEN);

    if (len >= HPDF_PASSWD_LEN) {
        HPDF_MemCpy (new_pwd, (HPDF_BYTE *)pwd, HPDF_PASSWD_LEN);
    } else {
        if (len > 0) {
            HPDF_MemCpy (new_pwd, (HPDF_BYTE *)pwd, len);
        }
        HPDF_MemCpy (new_pwd + len, HPDF_PADDING_STRING, HPDF_PASSWD_LEN - len);
    }
}